

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

bool __thiscall
MlmWrap::isHfTypeCurrentlySubbed(MlmWrap *this,string *dataName,string *moduleOrigin)

{
  size_t sVar1;
  _Alloc_hider _Var2;
  int iVar3;
  pointer pHVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  HighFreqDataType curType;
  string local_108;
  string *local_e8;
  string local_e0;
  HighFreqDataType local_c0;
  
  pHVar4 = (this->subbedHfDataTypes).
           super__Vector_base<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->subbedHfDataTypes).
      super__Vector_base<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>._M_impl.
      super__Vector_impl_data._M_finish != pHVar4) {
    lVar5 = 0;
    uVar6 = 0;
    local_e8 = dataName;
    do {
      HighFreqDataType::HighFreqDataType
                (&local_c0,
                 (HighFreqDataType *)
                 ((long)&(pHVar4->dataType).super_NetworkDataType._vptr_NetworkDataType + lVar5));
      HighFreqDataType::getName_abi_cxx11_(&local_108,&local_c0);
      sVar1 = dataName->_M_string_length;
      if ((sVar1 == local_108._M_string_length) &&
         ((sVar1 == 0 ||
          (iVar3 = bcmp((dataName->_M_dataplus)._M_p,local_108._M_dataplus._M_p,sVar1), iVar3 == 0))
         )) {
        HighFreqDataType::getOrigin_abi_cxx11_(&local_e0,&local_c0);
        _Var2._M_p = local_e0._M_dataplus._M_p;
        sVar1 = moduleOrigin->_M_string_length;
        if (sVar1 == local_e0._M_string_length) {
          if (sVar1 == 0) {
            bVar7 = true;
          }
          else {
            iVar3 = bcmp((moduleOrigin->_M_dataplus)._M_p,local_e0._M_dataplus._M_p,sVar1);
            bVar7 = iVar3 == 0;
          }
        }
        else {
          bVar7 = false;
        }
        dataName = local_e8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var2._M_p != &local_e0.field_2) {
          operator_delete(_Var2._M_p,local_e0.field_2._M_allocated_capacity + 1);
          dataName = local_e8;
        }
      }
      else {
        bVar7 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      HighFreqDataType::~HighFreqDataType(&local_c0);
      if (bVar7 != false) {
        return bVar7;
      }
      uVar6 = uVar6 + 1;
      pHVar4 = (this->subbedHfDataTypes).
               super__Vector_base<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0xa8;
    } while (uVar6 < (ulong)(((long)(this->subbedHfDataTypes).
                                    super__Vector_base<HFSubSockSettings,_std::allocator<HFSubSockSettings>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar4 >> 3)
                            * -0x30c30c30c30c30c3));
  }
  return false;
}

Assistant:

bool MlmWrap::isHfTypeCurrentlySubbed(std::string dataName, std::string moduleOrigin) {
    for (size_t i = 0; i < subbedHfDataTypes.size(); i++) {
        HighFreqDataType curType = subbedHfDataTypes.at(i).dataType;
        if (dataName == curType.getName() && moduleOrigin == curType.getOrigin()) {
            return(true); //if the type is in the availHfDataTypes list
        }
    }

    return(false);
}